

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UChar * __thiscall icu_63::ZNStringPool::get(ZNStringPool *this,UChar *s,UErrorCode *status)

{
  ZNStringPoolChunk *pZVar1;
  UBool UVar2;
  int32_t iVar3;
  ZNStringPoolChunk *this_00;
  UChar *size;
  ZNStringPoolChunk *local_78;
  UChar *destString;
  ZNStringPoolChunk *oldChunk;
  int32_t remainingLength;
  int32_t length;
  UChar *pooledString;
  UErrorCode *status_local;
  UChar *s_local;
  ZNStringPool *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    size = s;
    this_local = (ZNStringPool *)uhash_get_63(this->fHash,s);
    if (this_local == (ZNStringPool *)0x0) {
      iVar3 = u_strlen_63(s);
      if (2000 - this->fChunks->fLimit <= iVar3) {
        if (1999 < iVar3) {
          *status = U_INTERNAL_PROGRAM_ERROR;
          this_local = (ZNStringPool *)&EmptyString;
          return (UChar *)this_local;
        }
        pZVar1 = this->fChunks;
        this_00 = (ZNStringPoolChunk *)UMemory::operator_new((UMemory *)0xfb0,(size_t)size);
        local_78 = (ZNStringPoolChunk *)0x0;
        if (this_00 != (ZNStringPoolChunk *)0x0) {
          ZNStringPoolChunk::ZNStringPoolChunk(this_00);
          local_78 = this_00;
        }
        this->fChunks = local_78;
        if (this->fChunks == (ZNStringPoolChunk *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          this_local = (ZNStringPool *)&EmptyString;
          return (UChar *)this_local;
        }
        this->fChunks->fNext = pZVar1;
      }
      this_local = (ZNStringPool *)(this->fChunks->fStrings + this->fChunks->fLimit);
      u_strcpy_63((UChar *)this_local,s);
      this->fChunks->fLimit = iVar3 + 1 + this->fChunks->fLimit;
      uhash_put_63(this->fHash,this_local,this_local,status);
    }
  }
  else {
    this_local = (ZNStringPool *)&EmptyString;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *ZNStringPool::get(const UChar *s, UErrorCode &status) {
    const UChar *pooledString;
    if (U_FAILURE(status)) {
        return &EmptyString;
    }

    pooledString = static_cast<UChar *>(uhash_get(fHash, s));
    if (pooledString != NULL) {
        return pooledString;
    }

    int32_t length = u_strlen(s);
    int32_t remainingLength = POOL_CHUNK_SIZE - fChunks->fLimit;
    if (remainingLength <= length) {
        U_ASSERT(length < POOL_CHUNK_SIZE);
        if (length >= POOL_CHUNK_SIZE) {
            status = U_INTERNAL_PROGRAM_ERROR;
            return &EmptyString;
        }
        ZNStringPoolChunk *oldChunk = fChunks;
        fChunks = new ZNStringPoolChunk;
        if (fChunks == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return &EmptyString;
        }
        fChunks->fNext = oldChunk;
    }
    
    UChar *destString = &fChunks->fStrings[fChunks->fLimit];
    u_strcpy(destString, s);
    fChunks->fLimit += (length + 1);
    uhash_put(fHash, destString, destString, &status);
    return destString;
}